

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFPW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  Vector local_58;
  WorldCoordinates local_40;
  KFLOAT32 local_1c;
  WorldCoordinates *pWStack_18;
  KFLOAT32 totalTimeSinceReset_local;
  WorldCoordinates *PositionOut_local;
  DeadReckoningCalculator *this_local;
  
  local_1c = totalTimeSinceReset;
  pWStack_18 = PositionOut;
  PositionOut_local = &this->m_initPosition;
  DATA_TYPE::Vector::operator*(&local_58,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_40,&this->m_initPosition,&local_58);
  DATA_TYPE::WorldCoordinates::operator=(pWStack_18,&local_40);
  DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_40);
  DATA_TYPE::Vector::~Vector(&local_58);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFPW( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset)
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) );
}